

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

int Of_SetAddCut(Of_Cut_t **pCuts,int nCuts,int nCutNum)

{
  Of_Cut_t *pOVar1;
  Of_Cut_t *pOVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  int i;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  if (nCuts == 0) {
    return 1;
  }
  lVar10 = (long)nCuts;
  uVar8 = 0;
  uVar9 = 0;
  if (0 < nCuts) {
    uVar9 = (ulong)(uint)nCuts;
  }
  bVar3 = false;
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    pOVar1 = pCuts[lVar10];
    pOVar2 = pCuts[uVar8];
    if (((*(uint *)&pOVar1->field_0x10 >> 0x1b < *(uint *)&pOVar2->field_0x10 >> 0x1b) &&
        ((pOVar1->Sign & ~pOVar2->Sign) == 0)) &&
       (iVar4 = Of_SetCutIsContainedOrder(pOVar2,pOVar1), iVar4 != 0)) {
      *(uint *)&pCuts[uVar8]->field_0x10 = *(uint *)&pCuts[uVar8]->field_0x10 | 0xf8000000;
      bVar3 = true;
    }
  }
  uVar5 = nCuts;
  if (bVar3) {
    lVar7 = -1;
    if (-1 < lVar10) {
      lVar7 = lVar10;
    }
    iVar4 = 0;
    for (lVar10 = 0; lVar7 + 1 != lVar10; lVar10 = lVar10 + 1) {
      if (*(uint *)&pCuts[lVar10]->field_0x10 < 0xf8000000) {
        lVar6 = (long)iVar4;
        if (lVar6 < lVar10) {
          pOVar1 = pCuts[lVar6];
          pCuts[lVar6] = pCuts[lVar10];
          pCuts[lVar10] = pOVar1;
        }
        iVar4 = iVar4 + 1;
      }
    }
    nCuts = iVar4 - 1;
    uVar5 = nCuts;
  }
  for (; 0 < nCuts; nCuts = nCuts - 1) {
    pOVar1 = pCuts[(ulong)(uint)nCuts - 1];
    pOVar2 = pCuts[(uint)nCuts];
    if (pOVar1->Delay < pOVar2->Delay) break;
    if (pOVar1->Delay <= pOVar2->Delay) {
      if ((pOVar1->Flow < pOVar2->Flow) ||
         ((pOVar1->Flow <= pOVar2->Flow &&
          (*(uint *)&pOVar1->field_0x10 >> 0x1b < *(uint *)&pOVar2->field_0x10 >> 0x1b)))) break;
    }
    pCuts[(ulong)(uint)nCuts - 1] = pOVar2;
    pCuts[(uint)nCuts] = pOVar1;
  }
  iVar4 = nCutNum + -1;
  if ((int)(uVar5 + 1) < nCutNum + -1) {
    iVar4 = uVar5 + 1;
  }
  return iVar4;
}

Assistant:

static inline int Of_SetAddCut( Of_Cut_t ** pCuts, int nCuts, int nCutNum )
{
    if ( nCuts == 0 )
        return 1;
    nCuts = Of_SetLastCutContainsArea(pCuts, nCuts);
    Of_SetSortByArea( pCuts, nCuts );
    return Abc_MinInt( nCuts + 1, nCutNum - 1 );
}